

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::StructColumnData::Checkpoint
          (StructColumnData *this,RowGroup *row_group,ColumnCheckpointInfo *checkpoint_info)

{
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> _Var1;
  pointer psVar2;
  undefined1 auVar3 [8];
  pointer pSVar4;
  pointer pCVar5;
  undefined8 *in_RCX;
  pointer *__ptr;
  unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *sub_column;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 local_48 [8];
  _Tuple_impl<0UL,_duckdb::StructColumnCheckpointState_*,_std::default_delete<duckdb::StructColumnCheckpointState>_>
  local_40;
  __uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  local_38;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl =
       (tuple<duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>)
       (tuple<duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>)
       this;
  make_uniq<duckdb::StructColumnCheckpointState,duckdb::RowGroup&,duckdb::StructColumnData&,duckdb::PartialBlockManager&>
            ((duckdb *)&local_40,(RowGroup *)checkpoint_info,(StructColumnData *)row_group,
             *(PartialBlockManager **)*in_RCX);
  ColumnData::Checkpoint
            ((ColumnData *)local_48,
             (RowGroup *)((long)&row_group[1].row_group_lock.super___mutex_base._M_mutex + 8),
             checkpoint_info);
  pSVar4 = unique_ptr<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>,_true>
                         *)&local_40);
  auVar3 = local_48;
  local_48 = (undefined1  [8])0x0;
  _Var1._M_head_impl =
       (pSVar4->validity_state).
       super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
  (pSVar4->validity_state).
  super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl =
       (ColumnCheckpointState *)auVar3;
  if (_Var1._M_head_impl != (ColumnCheckpointState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnCheckpointState + 8))();
    if ((_Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>)local_48 !=
        (_Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>)0x0) {
      (*(*(_func_int ***)local_48)[1])();
    }
  }
  psVar2 = row_group[1].columns.
           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 row_group[1].columns.
                 super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                 .
                 super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; (pointer)this_00 != psVar2;
      this_00 = this_00 + 1) {
    pSVar4 = unique_ptr<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>,_true>
             ::operator->((unique_ptr<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>,_true>
                           *)&local_40);
    pCVar5 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                         *)this_00);
    (*pCVar5->_vptr_ColumnData[0x1c])(local_48,pCVar5,checkpoint_info);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>>>
                *)&pSVar4->child_states,
               (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                *)local_48);
    if (local_48 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_48)[1])();
    }
  }
  *(_Head_base<0UL,_duckdb::StructColumnCheckpointState_*,_false> *)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
   .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl =
       local_40.super__Head_base<0UL,_duckdb::StructColumnCheckpointState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
          )(_Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
            )local_38._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
             .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ColumnCheckpointState> StructColumnData::Checkpoint(RowGroup &row_group,
                                                               ColumnCheckpointInfo &checkpoint_info) {
	auto checkpoint_state = make_uniq<StructColumnCheckpointState>(row_group, *this, checkpoint_info.info.manager);
	checkpoint_state->validity_state = validity.Checkpoint(row_group, checkpoint_info);
	for (auto &sub_column : sub_columns) {
		checkpoint_state->child_states.push_back(sub_column->Checkpoint(row_group, checkpoint_info));
	}
	return std::move(checkpoint_state);
}